

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall cfd::core::Address::Address(Address *this)

{
  _Rb_tree_header *p_Var1;
  CfdSourceLocation local_48;
  
  this->type_ = kCfdSuccess;
  this->addr_type_ = kP2shAddress;
  this->witness_ver_ = kVersionNone;
  ::std::__cxx11::string::string((string *)&this->address_,"",(allocator *)&local_48);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  p_Var1 = &(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl = 0;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  local_48.filename = "cfdcore_address.cpp";
  local_48.line = 0xcb;
  local_48.funcname = "Address";
  logger::info<>(&local_48,"call Address()");
  return;
}

Assistant:

Address::Address()
    : type_(kMainnet),
      addr_type_(kP2shAddress),
      witness_ver_(kVersionNone),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  info(CFD_LOG_SOURCE, "call Address()");
}